

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

Matrix3f * Matrix3f::uniformScaling(Matrix3f *__return_storage_ptr__,float s)

{
  float s_local;
  
  Matrix3f(__return_storage_ptr__,s,0.0,0.0,0.0,s,0.0,0.0,0.0,s);
  return __return_storage_ptr__;
}

Assistant:

Matrix3f Matrix3f::uniformScaling( float s )
{
	return Matrix3f
	(
		s, 0, 0,
		0, s, 0,
		0, 0, s
	);
}